

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,curl_llist **list_ptr)

{
  curl_llist *list;
  undefined2 uVar1;
  int iVar2;
  curl_llist *list_00;
  char *pcVar3;
  undefined8 *p;
  char *pcVar4;
  char **ppcVar6;
  site_blacklist_entry *entry;
  long lVar5;
  
  list = *list_ptr;
  if (sites == (char **)0x0) {
    list_00 = (curl_llist *)0x0;
  }
  else {
    list_00 = Curl_llist_alloc(site_blacklist_llist_dtor);
    if (list_00 == (curl_llist *)0x0) {
      return CURLM_OUT_OF_MEMORY;
    }
    pcVar3 = *sites;
    if (pcVar3 != (char *)0x0) {
      ppcVar6 = sites + 1;
      do {
        pcVar3 = (*Curl_cstrdup)(pcVar3);
        if (pcVar3 == (char *)0x0) {
LAB_0013bfa8:
          Curl_llist_destroy(list_00,(void *)0x0);
          return CURLM_OUT_OF_MEMORY;
        }
        p = (undefined8 *)(*Curl_cmalloc)(0x10);
        if (p == (undefined8 *)0x0) {
          (*Curl_cfree)(pcVar3);
          goto LAB_0013bfa8;
        }
        pcVar4 = strchr(pcVar3,0x3a);
        if (pcVar4 == (char *)0x0) {
          uVar1 = 0x50;
        }
        else {
          *pcVar4 = '\0';
          lVar5 = strtol(pcVar4 + 1,(char **)0x0,10);
          uVar1 = (undefined2)lVar5;
        }
        *(undefined2 *)(p + 1) = uVar1;
        *p = pcVar3;
        iVar2 = Curl_llist_insert_next(list_00,list_00->tail,p);
        if (iVar2 == 0) {
          (*Curl_cfree)((void *)*p);
          *p = 0;
          (*Curl_cfree)(p);
          goto LAB_0013bfa8;
        }
        pcVar3 = *ppcVar6;
        ppcVar6 = ppcVar6 + 1;
      } while (pcVar3 != (char *)0x0);
    }
  }
  if (list != (curl_llist *)0x0) {
    Curl_llist_destroy(list,(void *)0x0);
  }
  *list_ptr = list_00;
  return CURLM_OK;
}

Assistant:

CURLMcode Curl_pipeline_set_site_blacklist(char **sites,
                                           struct curl_llist **list_ptr)
{
  struct curl_llist *old_list = *list_ptr;
  struct curl_llist *new_list = NULL;

  if(sites) {
    new_list = Curl_llist_alloc((curl_llist_dtor) site_blacklist_llist_dtor);
    if(!new_list)
      return CURLM_OUT_OF_MEMORY;

    /* Parse the URLs and populate the list */
    while(*sites) {
      char *hostname;
      char *port;
      struct site_blacklist_entry *entry;

      hostname = strdup(*sites);
      if(!hostname) {
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      entry = malloc(sizeof(struct site_blacklist_entry));
      if(!entry) {
        free(hostname);
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      port = strchr(hostname, ':');
      if(port) {
        *port = '\0';
        port++;
        entry->port = (unsigned short)strtol(port, NULL, 10);
      }
      else {
        /* Default port number for HTTP */
        entry->port = 80;
      }

      entry->hostname = hostname;

      if(!Curl_llist_insert_next(new_list, new_list->tail, entry)) {
        site_blacklist_llist_dtor(NULL, entry);
        Curl_llist_destroy(new_list, NULL);
        return CURLM_OUT_OF_MEMORY;
      }

      sites++;
    }
  }

  /* Free the old list */
  if(old_list) {
    Curl_llist_destroy(old_list, NULL);
  }

  /* This might be NULL if sites == NULL, i.e the blacklist is cleared */
  *list_ptr = new_list;

  return CURLM_OK;
}